

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReverseLayerParams::~ReverseLayerParams(ReverseLayerParams *this)

{
  ReverseLayerParams *this_local;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReverseLayerParams_00d57710;
  SharedDtor(this);
  google::protobuf::RepeatedField<bool>::~RepeatedField(&this->reversedim_);
  google::protobuf::internal::InternalMetadataWithArenaLite::~InternalMetadataWithArenaLite
            (&this->_internal_metadata_);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

ReverseLayerParams::~ReverseLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ReverseLayerParams)
  SharedDtor();
}